

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache.cc
# Opt level: O2

size_t read_cached_tag(io_buf *cache,example *ae)

{
  ulong n;
  size_t sVar1;
  char *c;
  
  sVar1 = io_buf::buf_read(cache,&c,8);
  if (7 < sVar1) {
    n = *(ulong *)c;
    c = c + 8;
    cache->head = c;
    sVar1 = io_buf::buf_read(cache,&c,n);
    if (n <= sVar1) {
      v_array<char>::clear(&ae->tag);
      push_many<char>(&ae->tag,c,n);
      return n + 8;
    }
  }
  return 0;
}

Assistant:

size_t read_cached_tag(io_buf& cache, example* ae)
{
  char* c;
  size_t tag_size;
  if (cache.buf_read(c, sizeof(tag_size)) < sizeof(tag_size))
    return 0;
  tag_size = *(size_t*)c;
  c += sizeof(tag_size);
  cache.set(c);
  if (cache.buf_read(c, tag_size) < tag_size)
    return 0;

  ae->tag.clear();
  push_many(ae->tag, c, tag_size);
  return tag_size + sizeof(tag_size);
}